

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ForLoopStatement *stmt)

{
  bool bVar1;
  reference ppVVar2;
  iterator this_00;
  reference ppEVar3;
  long in_RSI;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RDI;
  Expression *step;
  iterator __end3_2;
  iterator __begin3_2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3_2;
  type oldBreakStates;
  ConstantValue cv;
  int exitState;
  int bodyState;
  bool bodyWillExecute;
  Expression *init_1;
  VariableSymbol *var;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *__range3_1;
  Expression *init;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Expression *in_stack_00000320;
  FlowAnalysisBase *in_stack_00000328;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> in_stack_00000330;
  Expression *in_stack_fffffffffffffeb8;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_fffffffffffffec0;
  AbstractFlowAnalysis<TestAnalysis,_int> *this_01;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  Expression *in_stack_fffffffffffffee8;
  int exitState_00;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_108;
  long local_100;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Expression local_90;
  int local_60;
  byte local_59;
  Expression *local_58;
  VariableSymbol *local_50;
  VariableSymbol **local_48;
  __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
  local_40;
  long local_38;
  Expression *local_30;
  Expression **local_28;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RSI + 0x20;
  local_10 = in_RSI;
  local_20._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffeb8);
  local_28 = (Expression **)
             std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffeb8), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_20);
    local_30 = *ppEVar3;
    visit<slang::ast::Expression>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  local_38 = local_10 + 0x30;
  local_40._M_current =
       (VariableSymbol **)
       std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffeb8);
  local_48 = (VariableSymbol **)
             std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffeb8), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_40);
    local_50 = *ppVVar2;
    local_58 = ast::ValueSymbol::getInitializer((ValueSymbol *)0x24d3a8);
    if (local_58 != (Expression *)0x0) {
      visit<slang::ast::Expression>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  local_59 = 0;
  if (*(long *)(local_10 + 0x40) == 0) {
    local_60 = in_RDI->state;
    local_90.sourceRange.endLoc._4_4_ = TestAnalysis::unreachableState((TestAnalysis *)in_RDI);
  }
  else {
    visitCondition((AbstractFlowAnalysis<TestAnalysis,_int> *)
                   CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),&local_90);
    local_60 = in_RDI->stateWhenTrue;
    local_90.sourceRange.endLoc._4_4_ = in_RDI->stateWhenFalse;
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x24d445);
    if ((!bVar1) &&
       (bVar1 = std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::empty
                          ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
                           0x24d46a), !bVar1)) {
      local_b8 = *(undefined8 *)(local_10 + 0x30);
      uStack_b0 = *(undefined8 *)(local_10 + 0x38);
      in_stack_fffffffffffffecf =
           analysis::FlowAnalysisBase::willIterateAtLeastOnce
                     (in_stack_00000328,in_stack_00000330,in_stack_00000320);
      if ((bool)in_stack_fffffffffffffecf) {
        local_59 = 1;
      }
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x24d4f5);
  }
  this_01 = (AbstractFlowAnalysis<TestAnalysis,_int> *)&in_RDI->breakStates;
  SmallVector<int,_10UL>::SmallVector
            ((SmallVector<int,_10UL> *)this_01,(SmallVector<int,_10UL> *)in_stack_fffffffffffffeb8);
  SmallVectorBase<int>::clear((SmallVectorBase<int> *)this_01);
  setState(in_RDI,local_60);
  visit<slang::ast::Statement>(this_01,(Statement *)in_stack_fffffffffffffeb8);
  local_100 = local_10 + 0x48;
  local_108._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffeb8);
  this_00 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                       CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  while( true ) {
    exitState_00 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffeb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_108);
    in_stack_fffffffffffffee8 = *ppEVar3;
    visit<slang::ast::Expression>(this_01,in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_108);
  }
  if ((local_59 & 1) != 0) {
    TestAnalysis::meetState
              ((TestAnalysis *)this_01,(int *)in_stack_fffffffffffffeb8,(int *)0x24d620);
  }
  loopTail((AbstractFlowAnalysis<TestAnalysis,_int> *)this_00._M_current,exitState_00,
           (SmallVector<int,_10UL> *)in_RDI);
  SmallVector<int,_10UL>::~SmallVector((SmallVector<int,_10UL> *)0x24d646);
  return;
}

Assistant:

void visitStmt(const ForLoopStatement& stmt) {
        for (auto init : stmt.initializers)
            visit(*init);

        for (auto var : stmt.loopVars) {
            if (auto init = var->getInitializer())
                visit(*init);
        }

        bool bodyWillExecute = false;
        TState bodyState, exitState;
        if (stmt.stopExpr) {
            auto cv = visitCondition(*stmt.stopExpr);
            bodyState = std::move(stateWhenTrue);
            exitState = std::move(stateWhenFalse);

            // If we had a non-constant stop expression we want
            // to check whether there's at least a guarantee that
            // we will visit the loop body at least once, because then
            // we can allow the body state to definitely affect the
            // post-loop exit state.
            if (!cv && !stmt.loopVars.empty() &&
                willIterateAtLeastOnce(stmt.loopVars, *stmt.stopExpr)) {
                bodyWillExecute = true;
            }
        }
        else {
            // If there's no stop expression, the loop is infinite.
            bodyState = std::move(state);
            exitState = (DERIVED).unreachableState();
        }

        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        setState(std::move(bodyState));
        visit(stmt.body);

        for (auto step : stmt.steps)
            visit(*step);

        if (bodyWillExecute)
            (DERIVED).meetState(exitState, state);

        loopTail(std::move(exitState), std::move(oldBreakStates));
    }